

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

void __thiscall
despot::TagManhattanUpperBound::TagManhattanUpperBound(TagManhattanUpperBound *this,BaseTag *model)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int s;
  long lVar8;
  Floor floor;
  undefined8 local_78;
  int **ppiStack_70;
  vector<despot::Coord,_std::allocator<despot::Coord>_> local_68;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_50;
  
  despot::ParticleUpperBound::ParticleUpperBound(&this->super_ParticleUpperBound);
  despot::BeliefUpperBound::BeliefUpperBound(&this->super_BeliefUpperBound);
  *(undefined ***)this = &PTR__TagManhattanUpperBound_0011f7d8;
  *(undefined ***)&this->super_BeliefUpperBound = &PTR__TagManhattanUpperBound_0011f818;
  this->tag_model_ = model;
  (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_78._0_4_ = (model->floor_).num_rows_;
  local_78._4_4_ = (model->floor_).num_cols_;
  ppiStack_70 = (model->floor_).floor_;
  std::vector<despot::Coord,_std::allocator<despot::Coord>_>::vector
            (&local_68,&(model->floor_).cells_);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_50,&(model->floor_).dist_);
  iVar5 = (**(code **)(*(long *)this->tag_model_ + 0x10))();
  std::vector<double,_std::allocator<double>_>::resize(&this->value_,(long)iVar5);
  lVar8 = 0;
  while( true ) {
    iVar5 = (**(code **)(*(long *)this->tag_model_ + 0x10))();
    if (iVar5 <= lVar8) break;
    uVar6 = despot::Floor::GetCell((int)&local_78);
    uVar7 = despot::Floor::GetCell((int)&local_78);
    iVar5 = despot::Coord::ManhattanDistance(uVar6,uVar7);
    dVar1 = pow(_state_indexer,(double)iVar5);
    dVar4 = _state_indexer;
    dVar3 = BaseTag::TAG_REWARD;
    dVar2 = pow(_state_indexer,(double)iVar5);
    (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar8] = dVar2 * dVar3 - (1.0 - dVar1) / (1.0 - dVar4);
    lVar8 = lVar8 + 1;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_50);
  if (local_68.super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TagManhattanUpperBound(const BaseTag* model) :
		tag_model_(model) {
		Floor floor = tag_model_->floor_;
		value_.resize(tag_model_->NumStates());
		for (int s = 0; s < tag_model_->NumStates(); s++) {
			Coord rob = floor.GetCell(tag_model_->rob_[s]), opp = floor.GetCell(
				tag_model_->opp_[s]);
			int dist = Coord::ManhattanDistance(rob, opp);
			value_[s] = -(1 - Globals::Discount(dist)) / (1 - Globals::Discount())
				+ tag_model_->TAG_REWARD * Globals::Discount(dist);
		}
	}